

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Treap.h
# Opt level: O1

pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> __thiscall
Treap<unsigned_long>::split(Treap<unsigned_long> *this,Node *ptr,unsigned_long val)

{
  Node *pNVar1;
  Node *pNVar2;
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> pVar3;
  
  if (ptr == (Node *)0x0) {
    pNVar2 = (Node *)0x0;
    pNVar1 = (Node *)0x0;
  }
  else if (ptr->val < val) {
    pVar3 = split(this,ptr->right,val);
    ptr->right = pVar3.first;
    pNVar2 = pVar3.second;
    pNVar1 = ptr;
  }
  else {
    pVar3 = split(this,ptr->left,val);
    pNVar1 = pVar3.first;
    ptr->left = pVar3.second;
    pNVar2 = ptr;
  }
  pVar3.second = pNVar2;
  pVar3.first = pNVar1;
  return pVar3;
}

Assistant:

std::pair<Node *, Node *> split(Node *ptr, T val) {
    if (!ptr)
      return {nullptr, nullptr};

    if (val > ptr->val) {
      auto tmp = split(ptr->right, val);
      ptr->right = tmp.first;
      return {ptr, tmp.second};
    } else {
      auto tmp = split(ptr->left, val);
      ptr->left = tmp.second;
      return {tmp.first, ptr};
    }
  }